

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_1.cpp
# Opt level: O0

float sum(string *file_name)

{
  undefined8 uVar1;
  byte bVar2;
  _Ios_Iostate __a;
  runtime_error *this;
  float fVar3;
  exception *e;
  float sum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_218;
  ifstream ifs;
  string *file_name_local;
  
  std::ifstream::ifstream(&local_218,file_name,8);
  bVar2 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if ((bVar2 & 1) == 0) {
    uVar1 = *(undefined8 *)(local_218 + -0x18);
    __a = std::ios::exceptions();
    std::operator|(__a,_S_badbit);
    std::ios::exceptions((int)&local_218 + (int)uVar1);
    e._0_4_ = 0.0;
    while( true ) {
      bVar2 = std::ios::eof();
      if (((bVar2 ^ 0xff) & 1) == 0) break;
      fVar3 = read_int((istream *)&local_218);
      e._0_4_ = fVar3 + e._0_4_;
    }
    std::ifstream::~ifstream(&local_218);
    return e._0_4_;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sum,
                 "Could not open \'",file_name);
  std::operator+(&local_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sum,
                 "\' for reading.");
  std::runtime_error::runtime_error(this,(string *)&local_248);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

float sum(const std::string& file_name)
{
	std::ifstream ifs{ file_name };
	if (!ifs)
	{
		throw std::runtime_error("Could not open '" +
			file_name + "' for reading.");
	}
	ifs.exceptions(ifs.exceptions()|std::ios_base::badbit);
	float sum{ 0 };
	try
	{
		while (!ifs.eof())
		{
			sum += read_int(ifs);
		}
	}
	catch (const std::exception& e)
	{
		throw std::runtime_error("Found bad symbol in file '" + file_name
			+ "'. " + e.what());
	}
	return sum;
}